

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_FunctionResultCallWorks_Test::
~SemanticAnalyserTest_FunctionResultCallWorks_Test
          (SemanticAnalyserTest_FunctionResultCallWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, FunctionResultCallWorks)
{
  std::string source = R"SRC(
  fn f(x: f32): function
  {
    ret \(m: f32): f32 = { ret x*m; };
  }
  
  fn main(): f32
  {
    f(1)(23);
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}